

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lest.cpp
# Opt level: O0

void __thiscall anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,env *lest_env)

{
  ostream *poVar1;
  bool bVar2;
  failure *pfVar3;
  text local_4b0;
  text local_490;
  allocator<char> local_469;
  text local_468;
  allocator<char> local_441;
  text local_440;
  location local_420;
  message local_3f8;
  undefined1 local_379;
  text local_378;
  allocator<char> local_351;
  text local_350;
  allocator<char> local_329;
  text local_328;
  location local_308;
  Explicit local_2da;
  env__const local_2d9;
  Explicit *local_2d8;
  undefined1 local_2d0 [8];
  result score_1;
  text local_230;
  text local_210;
  allocator<char> local_1e9;
  text local_1e8;
  allocator<char> local_1c1;
  text local_1c0;
  location local_1a0;
  message local_178;
  undefined1 local_f9;
  text local_f8;
  allocator<char> local_d1;
  text local_d0;
  allocator<char> local_a9;
  text local_a8;
  location local_88;
  Nonexplicit local_4a;
  env__const local_49;
  Nonexplicit *local_48;
  undefined1 local_40 [8];
  result score;
  env *lest_env_local;
  anon_class_1_0_00000001 *this_local;
  
  score.decomposition.field_2._8_8_ = lest_env;
  do {
    local_48 = (Nonexplicit *)
               lest::expression_decomposer::operator<<<$_20::TEMPNAMEPLACEHOLDERVALUE(lest::
               env&)const::operator()(&local_49,&local_4a);
    lest::expression_lhs::operator_cast_to_result((result *)local_40,(expression_lhs *)&local_48);
    bVar2 = lest::result::operator_cast_to_bool((result *)local_40);
    if (bVar2) {
      local_f9 = 1;
      pfVar3 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/test/test_lest.cpp"
                 ,&local_a9);
      lest::location::location(&local_88,&local_a8,0x1a6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Nonexplicit{}",&local_d1);
      std::__cxx11::string::string((string *)&local_f8,(string *)&score);
      lest::failure::failure(pfVar3,&local_88,&local_d0,&local_f8);
      local_f9 = 0;
      __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
    }
    bVar2 = lest::env::pass((env *)score.decomposition.field_2._8_8_);
    if (bVar2) {
      poVar1 = *(ostream **)score.decomposition.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/test/test_lest.cpp"
                 ,&local_1c1);
      lest::location::location(&local_1a0,&local_1c0,0x1a6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"Nonexplicit{}",&local_1e9);
      std::__cxx11::string::string((string *)&local_210,(string *)&score);
      bVar2 = lest::env::zen((env *)score.decomposition.field_2._8_8_);
      lest::passing::passing((passing *)&local_178,&local_1a0,&local_1e8,&local_210,bVar2);
      lest::env::context_abi_cxx11_(&local_230,(env *)score.decomposition.field_2._8_8_);
      lest::report(poVar1,&local_178,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      lest::passing::~passing((passing *)&local_178);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      lest::location::~location(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
    }
    lest::result::~result((result *)local_40);
    bVar2 = lest::is_false();
  } while (bVar2);
  do {
    local_2d8 = (Explicit *)
                lest::expression_decomposer::operator<<<$_20::TEMPNAMEPLACEHOLDERVALUE(lest::
                env&)const::operator()(&local_2d9,&local_2da);
    lest::expression_lhs::operator_cast_to_result((result *)local_2d0,(expression_lhs *)&local_2d8);
    bVar2 = lest::result::operator_cast_to_bool((result *)local_2d0);
    if (bVar2) {
      local_379 = 1;
      pfVar3 = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/test/test_lest.cpp"
                 ,&local_329);
      lest::location::location(&local_308,&local_328,0x1a7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"Explicit{}",&local_351);
      std::__cxx11::string::string((string *)&local_378,(string *)&score_1);
      lest::failure::failure(pfVar3,&local_308,&local_350,&local_378);
      local_379 = 0;
      __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
    }
    bVar2 = lest::env::pass((env *)score.decomposition.field_2._8_8_);
    if (bVar2) {
      poVar1 = *(ostream **)score.decomposition.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/test/test_lest.cpp"
                 ,&local_441);
      lest::location::location(&local_420,&local_440,0x1a7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,"Explicit{}",&local_469);
      std::__cxx11::string::string((string *)&local_490,(string *)&score_1);
      bVar2 = lest::env::zen((env *)score.decomposition.field_2._8_8_);
      lest::passing::passing((passing *)&local_3f8,&local_420,&local_468,&local_490,bVar2);
      lest::env::context_abi_cxx11_(&local_4b0,(env *)score.decomposition.field_2._8_8_);
      lest::report(poVar1,&local_3f8,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      lest::passing::~passing((passing *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator(&local_469);
      lest::location::~location(&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
    }
    lest::result::~result((result *)local_2d0);
    bVar2 = lest::is_false();
  } while (bVar2);
  return;
}

Assistant:

operator bool() const { return true; }